

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

void __thiscall
el::base::utils::RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>::unregister
          (RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *this,
          HitCounter **ptr)

{
  long *__src;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar2;
  long *plVar3;
  long *__dest;
  undefined4 extraout_var_02;
  
  if (*ptr != (HitCounter *)0x0) {
    iVar1 = (*(this->
              super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
              ).super_ThreadSafe._vptr_ThreadSafe[5])();
    for (__dest = (long *)CONCAT44(extraout_var,iVar1);
        (iVar1 = (*(this->
                   super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
                   ).super_ThreadSafe._vptr_ThreadSafe[6])(this),
        __dest != (long *)CONCAT44(extraout_var_00,iVar1) && (*ptr != (HitCounter *)*__dest));
        __dest = __dest + 1) {
    }
    iVar1 = (*(this->
              super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
              ).super_ThreadSafe._vptr_ThreadSafe[6])(this);
    if ((__dest != (long *)CONCAT44(extraout_var_01,iVar1)) && (*__dest != 0)) {
      iVar1 = (*(this->
                super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
                ).super_ThreadSafe._vptr_ThreadSafe[0xb])(this);
      lVar2 = CONCAT44(extraout_var_02,iVar1);
      __src = __dest + 1;
      plVar3 = *(long **)(lVar2 + 8);
      if (__src != plVar3) {
        memmove(__dest,__src,(long)plVar3 - (long)__src);
        plVar3 = *(long **)(lVar2 + 8);
      }
      *(long **)(lVar2 + 8) = plVar3 + -1;
      if ((long *)*__dest != (long *)0x0) {
        (**(code **)(*(long *)*__dest + 8))();
        *__dest = 0;
      }
    }
  }
  return;
}

Assistant:

virtual void unregister(T_Ptr*& ptr) ELPP_FINAL {
    if (ptr) {
      iterator iter = this->begin();
      for (; iter != this->end(); ++iter) {
        if (ptr == *iter) {
          break;
        }
      }
      if (iter != this->end() && *iter != nullptr) {
        this->list().erase(iter);
        base::utils::safeDelete(*iter);
      }
    }
  }